

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O1

void pztopology::TPZPrism::BlendFactorForSide<double>
               (int *side,TPZVec<double> *xiVec,double *blendFactor,TPZVec<double> *blendFactorDxi)

{
  bool bVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  
  (*blendFactorDxi->_vptr_TPZVec[2])(blendFactorDxi,3);
  *blendFactor = 0.0;
  GetTolerance();
  bVar1 = CheckProjectionForSingularity<double>(side,xiVec);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Side projection is not regular and it should have been checked earlier. Aborting..",
               0x52);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzprism.cpp"
               ,0x17e);
  }
  (*blendFactorDxi->_vptr_TPZVec[2])(blendFactorDxi,3);
  if (0x13 < (uint)*side) {
    return;
  }
  pdVar2 = xiVec->fStore;
  switch(*side) {
  default:
    *blendFactor = 0.0;
    return;
  case 6:
    *blendFactor = (1.0 - pdVar2[2]) * 0.5 * (1.0 - pdVar2[1]) * (1.0 - pdVar2[1]);
    pdVar3 = blendFactorDxi->fStore;
    *pdVar3 = 0.0;
    pdVar3[1] = (1.0 - pdVar2[2]) * -(1.0 - pdVar2[1]);
    dVar4 = 1.0 - pdVar2[1];
    goto LAB_00dbe0e9;
  case 7:
    *blendFactor = (1.0 - pdVar2[2]) * 0.5 * (*pdVar2 + pdVar2[1]) * (*pdVar2 + pdVar2[1]);
    pdVar3 = blendFactorDxi->fStore;
    *pdVar3 = (1.0 - pdVar2[2]) * (pdVar2[1] + *pdVar2);
    pdVar3[1] = (1.0 - pdVar2[2]) * (pdVar2[1] + *pdVar2);
    dVar4 = pdVar2[1] + *pdVar2;
    goto LAB_00dbe0e9;
  case 8:
    *blendFactor = (1.0 - pdVar2[2]) * 0.5 * (1.0 - *pdVar2) * (1.0 - *pdVar2);
    pdVar3 = blendFactorDxi->fStore;
    *pdVar3 = (1.0 - pdVar2[2]) * -(1.0 - *pdVar2);
    pdVar3[1] = 0.0;
    dVar4 = 1.0 - *pdVar2;
LAB_00dbe0e9:
    dVar4 = dVar4 * dVar4 * -0.5;
LAB_00dbe1ab:
    pdVar3[2] = dVar4;
    return;
  case 9:
    *blendFactor = (1.0 - *pdVar2) - pdVar2[1];
    pdVar2 = blendFactorDxi->fStore;
    dVar4 = -1.0;
    dVar5 = -1.0;
    break;
  case 10:
    *blendFactor = *pdVar2;
    pdVar2 = blendFactorDxi->fStore;
    dVar4 = 1.0;
    goto LAB_00dbe000;
  case 0xb:
    *blendFactor = pdVar2[1];
    pdVar2 = blendFactorDxi->fStore;
    dVar4 = 0.0;
    dVar5 = 1.0;
    break;
  case 0xc:
    *blendFactor = (pdVar2[2] + 1.0) * 0.5 * (1.0 - pdVar2[1]) * (1.0 - pdVar2[1]);
    pdVar3 = blendFactorDxi->fStore;
    *pdVar3 = 0.0;
    pdVar3[1] = (pdVar2[2] + 1.0) * -(1.0 - pdVar2[1]);
    dVar4 = pdVar2[1];
    goto LAB_00dbe1a3;
  case 0xd:
    *blendFactor = (pdVar2[2] + 1.0) * 0.5 * (*pdVar2 + pdVar2[1]) * (*pdVar2 + pdVar2[1]);
    pdVar3 = blendFactorDxi->fStore;
    *pdVar3 = (pdVar2[2] + 1.0) * (pdVar2[1] + *pdVar2);
    pdVar3[1] = (pdVar2[2] + 1.0) * (pdVar2[1] + *pdVar2);
    pdVar3[2] = (pdVar2[1] + *pdVar2) * (pdVar2[1] + *pdVar2) * 0.5;
    return;
  case 0xe:
    *blendFactor = (pdVar2[2] + 1.0) * 0.5 * (1.0 - *pdVar2) * (1.0 - *pdVar2);
    pdVar3 = blendFactorDxi->fStore;
    *pdVar3 = (pdVar2[2] + 1.0) * -(1.0 - *pdVar2);
    pdVar3[1] = 0.0;
    dVar4 = *pdVar2;
LAB_00dbe1a3:
    dVar4 = (1.0 - dVar4) * (1.0 - dVar4) * 0.5;
    goto LAB_00dbe1ab;
  case 0xf:
    *blendFactor = (1.0 - pdVar2[2]) * 0.5;
    pdVar2 = blendFactorDxi->fStore;
    *pdVar2 = 0.0;
    pdVar2[1] = 0.0;
    dVar4 = -0.5;
    goto LAB_00dbe1e2;
  case 0x10:
    *blendFactor = 1.0 - pdVar2[1];
    pdVar2 = blendFactorDxi->fStore;
    dVar4 = 0.0;
    dVar5 = -1.0;
    break;
  case 0x11:
    *blendFactor = *pdVar2 + pdVar2[1];
    pdVar2 = blendFactorDxi->fStore;
    dVar4 = 1.0;
    dVar5 = 1.0;
    break;
  case 0x12:
    *blendFactor = 1.0 - *pdVar2;
    pdVar2 = blendFactorDxi->fStore;
    dVar4 = -1.0;
LAB_00dbe000:
    *pdVar2 = dVar4;
    pdVar2[1] = 0.0;
    pdVar2[2] = 0.0;
    return;
  case 0x13:
    *blendFactor = (pdVar2[2] + 1.0) * 0.5;
    pdVar2 = blendFactorDxi->fStore;
    *pdVar2 = 0.0;
    pdVar2[1] = 0.0;
    dVar4 = 0.5;
LAB_00dbe1e2:
    pdVar2[2] = dVar4;
    return;
  }
  *pdVar2 = dVar4;
  pdVar2[1] = dVar5;
  pdVar2[2] = 0.0;
  return;
}

Assistant:

void TPZPrism::BlendFactorForSide(const int &side, const TPZVec<T> &xiVec, T &blendFactor,
                                        TPZVec<T> &blendFactorDxi){
        blendFactorDxi.Resize(TPZPrism::Dimension, (T) 0);
        blendFactor = 0;
        const REAL tol = pztopology::GetTolerance();
        #ifdef PZDEBUG
        std::ostringstream sout;
        if(side < NCornerNodes || side >= NSides){
            sout<<"The side\t"<<side<<"is invalid. Aborting..."<<std::endl;
        }

        if(!pztopology::TPZPrism::IsInParametricDomain(xiVec,tol)){
            sout<<"The method BlendFactorForSide expects the point xi to correspond to coordinates of a point";
            sout<<" inside the parametric domain. Aborting...";
        }

        if(!sout.str().empty()){
            PZError<<std::endl<<sout.str()<<std::endl;
#ifdef PZ_LOG
            LOGPZ_FATAL(logger,sout.str().c_str());
#endif
            DebugStop();
        }
        #endif
        //if the point is singular, the blend factor and its derivatives should be zero
        if(!CheckProjectionForSingularity(side,xiVec)){
            std::cout<<"Side projection is not regular and it should have been checked earlier. Aborting.."<<std::endl;
            DebugStop();
            blendFactor = 0;
            for(int i = 0; i < blendFactorDxi.size(); i++) blendFactorDxi[i] = 0;
            return;
        }
        blendFactorDxi.Resize(TPZPrism::Dimension, (T) 0);
        const T &xi = xiVec[0];
        const T &eta = xiVec[1];
        const T &zeta = xiVec[2];
        switch(side){
            case  0:
            case  1:
            case  2:
            case  3:
            case  4:
            case  5:
                blendFactor = 0;
                return;
            case  6:
                blendFactor = 0.5*(1.-zeta)*(1.-eta)*(1.-eta);
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = -1.*(1 - eta)*(1 - zeta);
                blendFactorDxi[2] = -0.5*((1 - eta)*(1 - eta));
                return;
            case  7:
                blendFactor = 0.5*(1.-zeta)*(xi+eta)*(xi+eta);
                blendFactorDxi[0] =1.*(eta + xi)*(1 - zeta);
                blendFactorDxi[1] =1.*(eta + xi)*(1 - zeta);
                blendFactorDxi[2] =-0.5*((eta + xi)*(eta + xi));
                return;
            case  8:
                blendFactor = 0.5*(1.-zeta)*(1.-xi)*(1.-xi);
                blendFactorDxi[0] =-1.*(1 - xi)*(1 - zeta);
                blendFactorDxi[1] =0;
                blendFactorDxi[2] =-0.5*((1 - xi)*(1 - xi));
                return;
            case  9:
                blendFactor = 1. - xi - eta;
                blendFactorDxi[0] = -1;
                blendFactorDxi[1] = -1;
                blendFactorDxi[2] = 0;
                return;
            case 10:
                blendFactor = xi;
                blendFactorDxi[0] = 1;
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = 0;
                return;
            case 11:
                blendFactor = eta;
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = 1;
                blendFactorDxi[2] = 0;
                return;
            case 12:
                blendFactor = 0.5*(1.+zeta)*(1.-eta)*(1.-eta);
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = -1.*(1 - eta)*(1 + zeta);
                blendFactorDxi[2] = 0.5*((1 - eta)*(1 - eta));
                return;
            case 13:
                blendFactor = 0.5*(1.+zeta)*(xi+eta)*(xi+eta);
                blendFactorDxi[0] = 1.*(eta + xi)*(1 + zeta);
                blendFactorDxi[1] = 1.*(eta + xi)*(1 + zeta);
                blendFactorDxi[2] = 0.5*((eta + xi)*(eta + xi));
                return;
            case 14:
                blendFactor = 0.5*(1.+zeta)*(1.-xi)*(1.-xi);
                blendFactorDxi[0] = -1.*(1 - xi)*(1 + zeta);
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = 0.5*((1 - xi)*(1 - xi));
                return;
            case 15:
                blendFactor = 0.5*(1.-zeta);
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = -0.5;
                return;
            case 16:
                blendFactor = 1.-eta;
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = -1;
                blendFactorDxi[2] = 0;
                return;
            case 17:
                blendFactor = xi+eta;
                blendFactorDxi[0] = 1;
                blendFactorDxi[1] = 1;
                blendFactorDxi[2] = 0;
                return;
            case 18:
                blendFactor = 1.-xi;
                blendFactorDxi[0] = -1;
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = 0;
                return;
            case 19:
                blendFactor = 0.5*(1.+zeta);
                blendFactorDxi[0] = 0;
                blendFactorDxi[1] = 0;
                blendFactorDxi[2] = 0.5;
                return;
        }
    }